

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  int in_ECX;
  ulong in_RDX;
  void *in_RSI;
  bool bVar2;
  ImGuiPayload *payload;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  ImVector<unsigned_char> *this;
  int local_1c;
  
  pIVar1 = GImGui;
  this = (ImVector<unsigned_char> *)&GImGui->DragDropPayload;
  local_1c = in_ECX;
  if (in_ECX == 0) {
    local_1c = 1;
  }
  if ((local_1c == 1) || ((GImGui->DragDropPayload).DataFrameCount == -1)) {
    ImStrncpy((char *)this,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
              0x200b00);
    ImVector<unsigned_char>::resize(this,in_stack_ffffffffffffffcc);
    if (in_RDX < 0x11) {
      if (in_RDX == 0) {
        this->Size = 0;
        this->Capacity = 0;
      }
      else {
        memset(pIVar1->DragDropPayloadBufLocal,0,0x10);
        *(uchar **)this = pIVar1->DragDropPayloadBufLocal;
        memcpy(*(void **)this,in_RSI,in_RDX);
      }
    }
    else {
      ImVector<unsigned_char>::resize(this,in_stack_ffffffffffffffcc);
      *(uchar **)this = (pIVar1->DragDropPayloadBufHeap).Data;
      memcpy(*(void **)this,in_RSI,in_RDX);
    }
    *(int *)&this->Data = (int)in_RDX;
  }
  this[1].Capacity = pIVar1->FrameCount;
  bVar2 = true;
  if (pIVar1->DragDropAcceptFrameCount != pIVar1->FrameCount) {
    bVar2 = pIVar1->DragDropAcceptFrameCount == pIVar1->FrameCount + -1;
  }
  return bVar2;
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0); // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    // Return whether the payload has been accepted
    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}